

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

unique_ptr<pbrt::BDPTIntegrator,_std::default_delete<pbrt::BDPTIntegrator>_> __thiscall
pbrt::BDPTIntegrator::Create
          (BDPTIntegrator *this,ParameterDictionary *parameters,CameraHandle *camera,
          SamplerHandle *sampler,PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights,FileLoc *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Tuple_impl<0UL,_pbrt::BDPTIntegrator_*,_std::default_delete<pbrt::BDPTIntegrator>_> _Var2;
  bool visualizeStrategies;
  bool visualizeWeights;
  bool regularize;
  int maxDepth;
  BDPTIntegrator *this_00;
  string lightStrategy;
  string local_a8;
  string local_88;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *local_68;
  _Tuple_impl<0UL,_pbrt::BDPTIntegrator_*,_std::default_delete<pbrt::BDPTIntegrator>_> local_60;
  CameraHandle *local_58;
  SamplerHandle *local_50;
  PrimitiveHandle *local_48;
  TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
  local_40;
  TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_38;
  
  paVar1 = &lightStrategy.field_2;
  lightStrategy._M_dataplus._M_p = (pointer)paVar1;
  local_60.super__Head_base<0UL,_pbrt::BDPTIntegrator_*,_false>._M_head_impl =
       (_Head_base<0UL,_pbrt::BDPTIntegrator_*,_false>)
       (_Head_base<0UL,_pbrt::BDPTIntegrator_*,_false>)this;
  local_58 = camera;
  local_50 = sampler;
  local_48 = aggregate;
  std::__cxx11::string::_M_construct<char_const*>((string *)&lightStrategy,"maxdepth","");
  maxDepth = ParameterDictionary::GetOneInt(parameters,&lightStrategy,5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lightStrategy._M_dataplus._M_p != paVar1) {
    operator_delete(lightStrategy._M_dataplus._M_p,lightStrategy.field_2._M_allocated_capacity + 1);
  }
  lightStrategy._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&lightStrategy,"visualizestrategies","")
  ;
  visualizeStrategies = ParameterDictionary::GetOneBool(parameters,&lightStrategy,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lightStrategy._M_dataplus._M_p != paVar1) {
    operator_delete(lightStrategy._M_dataplus._M_p,lightStrategy.field_2._M_allocated_capacity + 1);
  }
  lightStrategy._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&lightStrategy,"visualizeweights","");
  visualizeWeights = ParameterDictionary::GetOneBool(parameters,&lightStrategy,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lightStrategy._M_dataplus._M_p != paVar1) {
    operator_delete(lightStrategy._M_dataplus._M_p,lightStrategy.field_2._M_allocated_capacity + 1);
  }
  local_68 = lights;
  if (visualizeStrategies) {
    if (maxDepth < 6) goto LAB_00442af2;
  }
  else if (maxDepth < 6 || !visualizeWeights) goto LAB_00442af2;
  Warning(loc,"visualizestrategies/visualizeweights was enabled, limiting maxdepth to 5");
  maxDepth = 5;
LAB_00442af2:
  paVar1 = &local_a8.field_2;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"lightsampler","");
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"power","");
  ParameterDictionary::GetOneString(&lightStrategy,parameters,&local_a8,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"regularize","");
  regularize = ParameterDictionary::GetOneBool(parameters,&local_a8,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  this_00 = (BDPTIntegrator *)operator_new(0xb8);
  local_88._M_dataplus._M_p =
       (pointer)(local_58->
                super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                ).bits;
  local_38.bits =
       (local_50->
       super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
       ).bits;
  local_40.bits =
       (local_48->
       super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
       ).bits;
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
            ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)&local_a8,local_68);
  BDPTIntegrator(this_00,(CameraHandle *)&local_88,(SamplerHandle *)&local_38,
                 (PrimitiveHandle *)&local_40,
                 (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)&local_a8,maxDepth
                 ,visualizeStrategies,visualizeWeights,&lightStrategy,regularize);
  _Var2.super__Head_base<0UL,_pbrt::BDPTIntegrator_*,_false>._M_head_impl =
       local_60.super__Head_base<0UL,_pbrt::BDPTIntegrator_*,_false>._M_head_impl;
  *(BDPTIntegrator **)local_60.super__Head_base<0UL,_pbrt::BDPTIntegrator_*,_false>._M_head_impl =
       this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_a8._M_dataplus._M_p,
                    local_a8.field_2._M_allocated_capacity - (long)local_a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lightStrategy._M_dataplus._M_p != &lightStrategy.field_2) {
    operator_delete(lightStrategy._M_dataplus._M_p,lightStrategy.field_2._M_allocated_capacity + 1);
  }
  return (unique_ptr<pbrt::BDPTIntegrator,_std::default_delete<pbrt::BDPTIntegrator>_>)
         _Var2.super__Head_base<0UL,_pbrt::BDPTIntegrator_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<BDPTIntegrator> BDPTIntegrator::Create(
    const ParameterDictionary &parameters, CameraHandle camera, SamplerHandle sampler,
    PrimitiveHandle aggregate, std::vector<LightHandle> lights, const FileLoc *loc) {
    int maxDepth = parameters.GetOneInt("maxdepth", 5);
    bool visualizeStrategies = parameters.GetOneBool("visualizestrategies", false);
    bool visualizeWeights = parameters.GetOneBool("visualizeweights", false);

    if ((visualizeStrategies || visualizeWeights) && maxDepth > 5) {
        Warning(loc, "visualizestrategies/visualizeweights was enabled, limiting "
                     "maxdepth to 5");
        maxDepth = 5;
    }

    std::string lightStrategy = parameters.GetOneString("lightsampler", "power");
    bool regularize = parameters.GetOneBool("regularize", false);
    return std::make_unique<BDPTIntegrator>(camera, sampler, aggregate, lights, maxDepth,
                                            visualizeStrategies, visualizeWeights,
                                            lightStrategy, regularize);
}